

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

bool __thiscall GlobOpt::TryTailDup(GlobOpt *this,BranchInstr *tailBranch)

{
  IRKind IVar1;
  char cVar2;
  OpCode OVar3;
  Type TVar4;
  BasicBlock *this_00;
  Type this_01;
  BasicBlock *block;
  byte bVar5;
  code *pcVar6;
  NodeBase *pNVar7;
  bool bVar8;
  uint sourceContextId;
  uint functionId;
  JITTimeFunctionBody *this_02;
  FunctionJITTimeInfo *this_03;
  LabelInstr *oldLabelInstr;
  SListCounted<IR::BranchInstr_*,_Memory::ArenaAllocator> *pSVar9;
  Type *ppBVar10;
  Instr *instr;
  undefined4 *puVar11;
  byte bVar12;
  BranchInstr *this_04;
  LabelInstr *this_05;
  LabelInstr *pLVar13;
  undefined1 local_70 [8];
  EditingIterator iter;
  Type local_34;
  
  this_02 = JITTimeWorkItem::GetJITFunctionBody
                      (((tailBranch->super_Instr).m_func)->topFunc->m_workItem);
  sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_02);
  this_03 = JITTimeWorkItem::GetJITTimeInfo(((tailBranch->super_Instr).m_func)->topFunc->m_workItem)
  ;
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_03);
  bVar8 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,TailDupPhase,sourceContextId,functionId);
  if (!bVar8) {
    OVar3 = (tailBranch->super_Instr).m_opcode;
    if (OVar3 < ADD) {
      if ((OVar3 != MultiBr) && (OVar3 != Br)) {
        return false;
      }
    }
    else {
      bVar8 = LowererMD::IsUnconditionalBranch(&tailBranch->super_Instr);
      if (!bVar8) {
        return false;
      }
    }
    bVar12 = 1;
    oldLabelInstr = (LabelInstr *)tailBranch;
    do {
      oldLabelInstr = (LabelInstr *)IR::Instr::GetPrevRealInstrOrLabel(&oldLabelInstr->super_Instr);
      IVar1 = (oldLabelInstr->super_Instr).m_kind;
      pLVar13 = oldLabelInstr;
      if ((IVar1 == InstrKindLabel) || (IVar1 == InstrKindProfiledLabel)) goto LAB_0043cb5f;
      if (((oldLabelInstr->super_Instr).field_0x38 & 0x10) != 0) goto LAB_0043cb4c;
      bVar8 = OpCodeAttr::CanCSE((oldLabelInstr->super_Instr).m_opcode);
      bVar5 = bVar12 & bVar8;
      bVar12 = 0;
    } while (bVar5 != 0);
    IVar1 = (oldLabelInstr->super_Instr).m_kind;
LAB_0043cb4c:
    if ((IVar1 == InstrKindProfiledLabel) || (IVar1 == InstrKindLabel)) {
LAB_0043cb5f:
      do {
        pLVar13 = (LabelInstr *)(pLVar13->super_Instr).m_prev;
        IVar1 = (pLVar13->super_Instr).m_kind;
        if ((IVar1 != InstrKindProfiledLabel) && (IVar1 != InstrKindLabel)) break;
      } while ((SListCounted<IR::BranchInstr_*,_Memory::ArenaAllocator> *)
               (pLVar13->labelRefs).
               super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
               super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
               super_SListNodeBase<Memory::ArenaAllocator>.next == &pLVar13->labelRefs);
      this_00 = oldLabelInstr->m_block;
      TVar4 = (this_00->predList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
              super_RealCount.count;
      pSVar9 = &oldLabelInstr->labelRefs;
      iter.super_EditingIterator.super_Iterator.current = (NodeBase *)0x0;
      local_70 = (undefined1  [8])pSVar9;
      iter.super_EditingIterator.super_Iterator.list =
           (SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount> *)pSVar9;
      bVar8 = SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::Next
                        ((EditingIterator *)local_70);
      local_34 = 0;
      if (bVar8) {
        local_34 = 0;
        iter.super_EditingIterator.last = (NodeBase *)__tls_get_addr(&PTR_01548f08);
        do {
          ppBVar10 = SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                               ((Iterator *)local_70);
          this_05 = (LabelInstr *)*ppBVar10;
          OVar3 = (this_05->super_Instr).m_opcode;
          if (OVar3 < ADD) {
            if ((OVar3 == MultiBr) || (OVar3 == Br)) goto LAB_0043cc28;
          }
          else {
            bVar8 = LowererMD::IsUnconditionalBranch((Instr *)this_05);
            if (bVar8) {
              this_05 = (LabelInstr *)*ppBVar10;
LAB_0043cc28:
              cVar2 = *(char *)((long)&(this_05->labelRefs).
                                       super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>
                                       .
                                       super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>
                                       .super_SListNodeBase<Memory::ArenaAllocator>.next + 1);
              if ((this_05->labelRefs).
                  super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.allocator ==
                  (Type)0x0) {
                if (cVar2 == '\0') {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  pNVar7 = iter.super_EditingIterator.last;
                  *(undefined4 *)&(iter.super_EditingIterator.last)->next = 1;
                  bVar8 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                                     ,0x20e,"(m_isMultiBranch)","m_isMultiBranch");
                  if (!bVar8) goto LAB_0043ce47;
                  *(undefined4 *)&pNVar7->next = 0;
                }
              }
              else {
                if (cVar2 != '\0') {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  pNVar7 = iter.super_EditingIterator.last;
                  *(undefined4 *)&(iter.super_EditingIterator.last)->next = 1;
                  bVar8 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                                     ,0x209,"(!m_isMultiBranch)","!m_isMultiBranch");
                  if (!bVar8) goto LAB_0043ce47;
                  *(undefined4 *)&pNVar7->next = 0;
                  this_05 = (LabelInstr *)*ppBVar10;
                }
                if (this_05 != (LabelInstr *)tailBranch && this_05 != pLVar13) {
                  this_04 = (BranchInstr *)(oldLabelInstr->super_Instr).m_next;
                  if (this_04 != tailBranch) {
                    do {
                      this_01 = *ppBVar10;
                      instr = IR::Instr::Copy(&this_04->super_Instr,true);
                      IR::Instr::InsertBefore(&this_01->super_Instr,instr);
                      this_04 = (BranchInstr *)(this_04->super_Instr).m_next;
                    } while (this_04 != tailBranch);
                    this_05 = (LabelInstr *)*ppBVar10;
                  }
                  IR::BranchInstr::ReplaceTarget
                            ((BranchInstr *)this_05,oldLabelInstr,tailBranch->m_branchTarget);
                  for (; (IVar1 = (this_05->super_Instr).m_kind, IVar1 != InstrKindLabel &&
                         (IVar1 != InstrKindProfiledLabel));
                      this_05 = (LabelInstr *)(this_05->super_Instr).m_prev) {
                  }
                  block = this_05->m_block;
                  BasicBlock::RemovePred(this_00,block,this->func->m_fg);
                  FlowGraph::AddEdge(this->func->m_fg,block,tailBranch->m_branchTarget->m_block);
                  local_34 = local_34 + 1;
                }
              }
            }
          }
          bVar8 = SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::
                  Next((EditingIterator *)local_70);
        } while (bVar8);
      }
      if (local_34 == TVar4) {
        if ((SListCounted<IR::BranchInstr_*,_Memory::ArenaAllocator> *)
            (pSVar9->super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>).
            super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
            super_SListNodeBase<Memory::ArenaAllocator>.next != pSVar9) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar11 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x342,"(mergeLabel->labelRefs.Empty())",
                             "Should not remove block with referenced label.");
          if (!bVar8) {
LAB_0043ce47:
            pcVar6 = (code *)invalidInstructionException();
            (*pcVar6)();
          }
          *puVar11 = 0;
        }
        FlowGraph::RemoveBlock(this->func->m_fg,this_00,(GlobOpt *)0x0,true);
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool
GlobOpt::TryTailDup(IR::BranchInstr *tailBranch)
{
    if (PHASE_OFF(Js::TailDupPhase, tailBranch->m_func->GetTopFunc()))
    {
        return false;
    }

    if (tailBranch->IsConditional())
    {
        return false;
    }

    IR::Instr *instr;
    uint instrCount = 0;
    for (instr = tailBranch->GetPrevRealInstrOrLabel(); !instr->IsLabelInstr(); instr = instr->GetPrevRealInstrOrLabel())
    {
        if (instr->HasBailOutInfo())
        {
            break;
        }
        if (!OpCodeAttr::CanCSE(instr->m_opcode))
        {
            // Consider: We could be more aggressive here
            break;
        }

        instrCount++;

        if (instrCount > 1)
        {
            // Consider: If copy handled single-def tmps renaming, we could do more instrs
            break;
        }
    }

    if (!instr->IsLabelInstr())
    {
        return false;
    }

    IR::LabelInstr *mergeLabel = instr->AsLabelInstr();
    IR::Instr *mergeLabelPrev = mergeLabel->m_prev;

    // Skip unreferenced labels
    while (mergeLabelPrev->IsLabelInstr() && mergeLabelPrev->AsLabelInstr()->labelRefs.Empty())
    {
        mergeLabelPrev = mergeLabelPrev->m_prev;
    }

    BasicBlock* labelBlock = mergeLabel->GetBasicBlock();
    uint origPredCount = labelBlock->GetPredList()->Count();
    uint dupCount = 0;

    // We are good to go. Let's do the tail duplication.
    FOREACH_SLISTCOUNTED_ENTRY_EDITING(IR::BranchInstr*, branchEntry, &mergeLabel->labelRefs, iter)
    {
        if (branchEntry->IsUnconditional() && !branchEntry->IsMultiBranch() && branchEntry != mergeLabelPrev && branchEntry != tailBranch)
        {
            for (instr = mergeLabel->m_next; instr != tailBranch; instr = instr->m_next)
            {
                branchEntry->InsertBefore(instr->Copy());
            }

            instr = branchEntry;
            branchEntry->ReplaceTarget(mergeLabel, tailBranch->GetTarget());

            while(!instr->IsLabelInstr())
            {
                instr = instr->m_prev;
            }
            BasicBlock* branchBlock = instr->AsLabelInstr()->GetBasicBlock();

            labelBlock->RemovePred(branchBlock, func->m_fg);
            func->m_fg->AddEdge(branchBlock, tailBranch->GetTarget()->GetBasicBlock());

            dupCount++;
        }
    } NEXT_SLISTCOUNTED_ENTRY_EDITING;

    // If we've duplicated everywhere, tail block is dead and should be removed.
    if (dupCount == origPredCount)
    {
        AssertMsg(mergeLabel->labelRefs.Empty(), "Should not remove block with referenced label.");
        func->m_fg->RemoveBlock(labelBlock, nullptr, true);
    }

    return true;
}